

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::calcEntity(Map *this,int n)

{
  int n_local;
  Map *this_local;
  
  if ((((this->entity[n] != (Entity *)0x0) &&
       (this->entity[n]->y = this->entity[n]->y + 0.3,
       (float)this->fieldBreakpoint <= this->entity[n]->y)) &&
      (this->entity[n]->y <= (float)(this->fieldBreakpoint + this->palette->h))) &&
     (((float)this->palette->pos <= this->entity[n]->x - 16.0 &&
      (this->entity[n]->x - 16.0 <= (float)(this->palette->pos + this->palette->w))))) {
    parseAward(this,n);
    removeEntity(this,n);
  }
  return;
}

Assistant:

void Map::calcEntity(int n){
    if(entity[n]){
        entity[n]->y += AWARD_SPEED;
        if(entity[n]->y >= fieldBreakpoint && entity[n]->y <= fieldBreakpoint + palette->h
                && entity[n]->x - ICON_W >= palette->pos && entity[n]->x - ICON_W <= palette->pos + palette->w){
            parseAward(n);
            removeEntity(n);
        }
    }
}